

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

bool __thiscall
acto::core::anon_unknown_0::binding_context_t::process_actors
          (binding_context_t *this,bool need_delete)

{
  _Hash_node_base *p_Var1;
  long *plVar2;
  int iVar3;
  _Hash_node_base *p_Var4;
  undefined7 in_register_00000031;
  bool bVar5;
  unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> msg;
  long *local_50;
  long *local_48;
  undefined4 local_3c;
  binding_context_t *local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000031,need_delete);
  runtime_t::instance();
  p_Var4 = (this->actors)._M_h._M_before_begin._M_nxt;
  if (p_Var4 == (_Hash_node_base *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = false;
    local_38 = this;
    do {
      do {
        object_t::select_message((object_t *)p_Var4[1]._M_nxt);
        plVar2 = local_48;
        if (local_48 != (long *)0x0) {
          local_50 = local_48;
          local_48 = (long *)0x0;
          (*runtime_t::instance::value.super_callbacks._vptr_callbacks[2])
                    (&runtime_t::instance::value,p_Var4[1]._M_nxt,&local_50);
          if (local_50 != (long *)0x0) {
            (**(code **)(*local_50 + 8))();
          }
          local_50 = (long *)0x0;
          bVar5 = true;
        }
        if (local_48 != (long *)0x0) {
          (**(code **)(*local_48 + 8))();
        }
      } while (plVar2 != (long *)0x0);
      p_Var1 = p_Var4[1]._M_nxt;
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)(p_Var1 + 1));
      if (iVar3 != 0) {
        std::__throw_system_error(iVar3);
      }
      *(byte *)&p_Var4[1]._M_nxt[0xc]._M_nxt = *(byte *)&p_Var4[1]._M_nxt[0xc]._M_nxt & 0xf7;
      pthread_mutex_unlock((pthread_mutex_t *)(p_Var1 + 1));
      if ((char)local_3c != '\0') {
        runtime_t::deconstruct_object(&runtime_t::instance::value,(object_t *)p_Var4[1]._M_nxt);
      }
      p_Var4 = p_Var4->_M_nxt;
      this = local_38;
    } while (p_Var4 != (_Hash_node_base *)0x0);
  }
  if ((char)local_3c != '\0') {
    for (p_Var4 = (this->actors)._M_h._M_before_begin._M_nxt; p_Var4 != (_Hash_node_base *)0x0;
        p_Var4 = p_Var4->_M_nxt) {
      runtime_t::release(&runtime_t::instance::value,(object_t *)p_Var4[1]._M_nxt);
    }
    std::
    _Hashtable<acto::core::object_t_*,_acto::core::object_t_*,_std::allocator<acto::core::object_t_*>,_std::__detail::_Identity,_std::equal_to<acto::core::object_t_*>,_std::hash<acto::core::object_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::clear(&(this->actors)._M_h);
  }
  return bVar5;
}

Assistant:

bool process_actors(const bool need_delete) {
    auto runtime = runtime_t::instance();
    bool something_was_processed = false;
    // TODO: - switch between active actors to balance message processing.
    //       - detect message loop.
    for (auto ai = actors.cbegin(); ai != actors.cend(); ++ai) {
      while (auto msg = (*ai)->select_message()) {
        runtime->handle_message(*ai, std::move(msg));
        something_was_processed = true;
      }
      {
        std::lock_guard<std::mutex> g((*ai)->cs);
        (*ai)->scheduled = false;
      }
      if (need_delete) {
        runtime->deconstruct_object(*ai);
      }
    }

    if (need_delete) {
      for (auto ai = actors.cbegin(); ai != actors.cend(); ++ai) {
        runtime->release(*ai);
      }

      actors.clear();
    }

    return something_was_processed;
  }